

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom2gsf.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  char *pcVar7;
  size_t sVar8;
  mapped_type *pmVar9;
  char *pcVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  char *endptr;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tags;
  char gsf_path [4096];
  char libname [4096];
  uint32_t local_20bc;
  long local_20b8;
  char *local_20b0;
  key_type local_20a0;
  ulong local_2080;
  char *local_2078;
  char **local_2070;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2068;
  char local_2038 [4];
  undefined1 auStack_2034 [4];
  undefined1 auStack_2030 [4088];
  char local_1038 [4104];
  
  if (argc == 1) {
LAB_00104843:
    usage(*argv);
  }
  else {
    local_2078 = (char *)0x0;
    local_20b8 = 0;
    memset(local_2038,0,0x1000);
    memset(local_1038,0,0x1000);
    if (argc < 2) {
      local_20b8._0_4_ = 0x8000000;
      iVar12 = 1;
      local_20b0 = (char *)0x0;
      local_20bc = 0x8000000;
    }
    else {
      iVar12 = 1;
      bVar3 = true;
      bVar4 = false;
      local_20b0 = (char *)0x0;
      do {
        pcVar10 = argv[iVar12];
        if (*pcVar10 != '-') break;
        iVar5 = strcmp(pcVar10,"--help");
        if (iVar5 == 0) goto LAB_00104843;
        iVar5 = strcmp(pcVar10,"-m");
        if (iVar5 != 0) {
          iVar5 = strcmp(pcVar10,"-o");
          if (iVar5 == 0) {
            if (iVar12 + 1 < argc) {
              pcVar7 = argv[iVar12 + 1];
              pcVar10 = local_2038;
LAB_00104a56:
              iVar12 = iVar12 + 1;
              strcpy(pcVar10,pcVar7);
              goto LAB_00104a5b;
            }
          }
          else {
            iVar5 = strcmp(pcVar10,"--load");
            if (iVar5 == 0) {
              iVar12 = iVar12 + 1;
              if (iVar12 < argc) {
                local_20b8 = strtol(argv[iVar12],&local_2078,0x10);
                if (((*local_2078 != '\0') || (piVar6 = __errno_location(), *piVar6 == 0x22)) ||
                   (local_20b8 < 0)) {
                  pcVar10 = argv[iVar12];
                  pcVar7 = "Error: Number format error \"%s\"\n";
                  goto LAB_00104d7b;
                }
                if (((uint)local_20b8 & 0xfffc0000) != 0x2000000 &&
                    ((uint)local_20b8 & 0xfe000000) != 0x8000000) {
                  main_cold_1();
                  return 1;
                }
                bVar3 = false;
                goto LAB_00104a5b;
              }
            }
            else {
              iVar5 = strcmp(pcVar10,"--lib");
              if (iVar5 == 0) {
                if (iVar12 + 1 < argc) {
                  pcVar7 = argv[iVar12 + 1];
                  pcVar10 = local_1038;
                  goto LAB_00104a56;
                }
              }
              else {
                iVar5 = strcmp(pcVar10,"--psfby");
                if ((iVar5 != 0) && (iVar5 = strcmp(pcVar10,"--gsfby"), iVar5 != 0)) {
                  pcVar7 = "Error: Unknown option \"%s\"\n";
                  goto LAB_00104d7b;
                }
                iVar12 = iVar12 + 1;
                if (iVar12 < argc) {
                  local_20b0 = argv[iVar12];
                  goto LAB_00104a5b;
                }
              }
            }
          }
          pcVar7 = "Error: Too few arguments for \"%s\"\n";
LAB_00104d7b:
          fprintf(_stderr,pcVar7,pcVar10);
          return 1;
        }
        bVar4 = true;
LAB_00104a5b:
        iVar12 = iVar12 + 1;
      } while (iVar12 < argc);
      local_20bc = 0x8000000;
      if (bVar4) {
        local_20bc = 0x2000000;
      }
      if (bVar3) {
        local_20b8._0_4_ = local_20bc;
      }
    }
    if (argc == iVar12) {
      main_cold_3();
    }
    else {
      if ((argc - iVar12 < 2) || (local_2038[0] == '\0')) {
        uVar11 = 0;
        uVar14 = (ulong)(uint)(argc - iVar12);
        if (argc - iVar12 != 0 && iVar12 <= argc) {
          paVar1 = &local_20a0.field_2;
          local_2070 = argv + iVar12;
          lVar13 = 0;
          uVar11 = 0;
          local_2080 = uVar14;
          do {
            pcVar10 = local_2070[lVar13];
            if (local_2038[0] == '\0') {
              strcpy(local_2038,pcVar10);
              pcVar7 = path_findext(local_2038);
              cVar2 = local_1038[0];
              if (pcVar7 != (char *)0x0) {
                *pcVar7 = '\0';
              }
              sVar8 = strlen(local_2038);
              if (cVar2 == '\0') {
                auStack_2034[sVar8] = 0;
                builtin_strncpy(local_2038 + sVar8,".gsf",4);
              }
              else {
                builtin_strncpy(local_2038 + sVar8,".minigsf",8);
                auStack_2030[sVar8] = 0;
              }
            }
            local_2068._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_2068._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_2068._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_2068._M_impl.super__Rb_tree_header._M_header;
            local_2068._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_2068._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_2068._M_impl.super__Rb_tree_header._M_header._M_left;
            if (local_1038[0] != '\0') {
              local_20a0._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_20a0,"_lib","");
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&local_2068,&local_20a0);
              pcVar7 = (char *)pmVar9->_M_string_length;
              strlen(local_1038);
              std::__cxx11::string::_M_replace((ulong)pmVar9,0,pcVar7,(ulong)local_1038);
              uVar14 = local_2080;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_20a0._M_dataplus._M_p != paVar1) {
                operator_delete(local_20a0._M_dataplus._M_p,
                                local_20a0.field_2._M_allocated_capacity + 1);
              }
            }
            if ((local_20b0 != (char *)0x0) && (*local_20b0 != '\0')) {
              local_20a0._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_20a0,"gsfby","");
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&local_2068,&local_20a0);
              pcVar7 = (char *)pmVar9->_M_string_length;
              strlen(local_20b0);
              std::__cxx11::string::_M_replace((ulong)pmVar9,0,pcVar7,(ulong)local_20b0);
              uVar14 = local_2080;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_20a0._M_dataplus._M_p != paVar1) {
                operator_delete(local_20a0._M_dataplus._M_p,
                                local_20a0.field_2._M_allocated_capacity + 1);
              }
            }
            bVar4 = rom2gsf(pcVar10,local_2038,local_20bc,(uint32_t)local_20b8,
                            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_2068);
            uVar11 = uVar11 + !bVar4;
            puts(local_2038);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree(&local_2068);
            lVar13 = lVar13 + 1;
          } while ((int)uVar14 != (int)lVar13);
        }
        if (uVar11 != 0) {
          fprintf(_stderr,"%d error(s)\n",(ulong)uVar11);
        }
        return (uint)(uVar11 != 0);
      }
      main_cold_2();
    }
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc == 1) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	long longval;
	char *endptr = NULL;

	bool multiboot = false;
	uint32_t load_offset = 0;
	bool default_load_offset = true;
	char gsf_path[PATH_MAX] = { '\0' };
	char libname[PATH_MAX] = { '\0' };

	char *psfby = NULL;

	int argi = 1;
	while (argi < argc && argv[argi][0] == '-') {
		if (strcmp(argv[argi], "--help") == 0) {
			usage(argv[0]);
			return EXIT_FAILURE;
		}
		else if (strcmp(argv[argi], "-m") == 0) {
			multiboot = true;
		}
		else if (strcmp(argv[argi], "-o") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			strcpy(gsf_path, argv[argi + 1]);

			argi++;
		}
		else if (strcmp(argv[argi], "--load") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			longval = strtol(argv[argi + 1], &endptr, 16);
			if (*endptr != '\0' || errno == ERANGE || longval < 0)
			{
				fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 1]);
				return EXIT_FAILURE;
			}
			load_offset = longval;
			default_load_offset = false;

			if (!((load_offset >= 0x8000000 && load_offset <= 0x9ffffff) || (load_offset >= 0x2000000 && load_offset <= 0x203ffff))) {
				fprintf(stderr, "Error: Load offset 0x%08X is out of range\n", load_offset);
				fprintf(stderr, "       Valid ranges are 0x8000000..0x9FFFFFF and 0x2000000..0x203FFFF (for multiboot ROM)\n");
				return EXIT_FAILURE;
			}

			argi++;
		}
		else if (strcmp(argv[argi], "--lib") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			strcpy(libname, argv[argi + 1]);

			argi++;
		}
		else if (strcmp(argv[argi], "--psfby") == 0 || strcmp(argv[argi], "--gsfby") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			psfby = argv[argi + 1];

			argi++;
		}
		else {
			fprintf(stderr, "Error: Unknown option \"%s\"\n", argv[argi]);
			return EXIT_FAILURE;
		}
		argi++;
	}

	uint32_t gsf_entrypoint = multiboot ? 0x02000000 : 0x08000000;
	if (default_load_offset) {
		load_offset = multiboot ? 0x02000000 : 0x08000000;
	}

	int argnum = argc - argi;
	if (argnum == 0) {
		fprintf(stderr, "Error: No input files\n");
		return EXIT_FAILURE;
	}
	if (argnum > 1 && strcmp(gsf_path, "") != 0) {
		fprintf(stderr, "Error: Unable to specify output filename for multiple inputs\n");
		return EXIT_FAILURE;
	}

	int num_error = 0;
	for (; argi < argc; argi++) {
		const char * rom_path = argv[argi];
		const char * rom_ext = path_findext(rom_path);

		if (strcmp(gsf_path, "") == 0) {
			strcpy(gsf_path, rom_path);
			path_stripext(gsf_path);
			if (strcmp(libname, "") != 0) {
				strcat(gsf_path, ".minigsf");
			}
			else {
				strcat(gsf_path, ".gsf");
			}
		}

		std::map<std::string, std::string> tags;
		if (strcmp(libname, "") != 0) {
			tags["_lib"] = libname;
		}

		if (psfby != NULL && strcmp(psfby, "") != 0) {
			tags["gsfby"] = psfby;
		}

		if (!rom2gsf(rom_path, gsf_path, gsf_entrypoint, load_offset, tags)) {
			num_error++;
		}

		puts(gsf_path);
	}

	if (num_error != 0) {
		fprintf(stderr, "%d error(s)\n", num_error);
	}

	return (num_error == 0) ? EXIT_SUCCESS : EXIT_FAILURE;
}